

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fileHasMoved(unixFile *pFile)

{
  int iVar1;
  uint uVar2;
  stat buf;
  
  if (pFile->pInode != (unixInodeInfo *)0x0) {
    iVar1 = (*aSyscall[4].pCurrent)(pFile->zPath,&buf);
    if (iVar1 == 0) {
      uVar2 = (uint)(buf.st_ino != (pFile->pInode->fileId).ino);
    }
    else {
      uVar2 = 1;
    }
    return uVar2;
  }
  return 0;
}

Assistant:

static int fileHasMoved(unixFile *pFile){
#if OS_VXWORKS
  return pFile->pInode!=0 && pFile->pId!=pFile->pInode->fileId.pId;
#else
  struct stat buf;
  return pFile->pInode!=0 &&
      (osStat(pFile->zPath, &buf)!=0
         || (u64)buf.st_ino!=pFile->pInode->fileId.ino);
#endif
}